

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O1

void __thiscall
Js::ScriptContextProfiler::Initialize
          (ScriptContextProfiler *this,PageAllocator *pageAllocator,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  Profiler *pPVar4;
  ArenaAllocator *pAVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->profilerArena != (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextProfiler.cpp"
                                ,0x29,"(!IsInitialized())","!IsInitialized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_58 = (undefined1  [8])&Memory::ArenaAllocator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2e753e0;
  data.filename._0_4_ = 0x2a;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
            new<Memory::HeapAllocator>(0x80,alloc,0x300d4a);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (this_00,L"Profiler",pageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->profilerArena = (ArenaAllocator *)this_00;
  pPVar4 = (Profiler *)new<Memory::ArenaAllocator>(0x18d0,(ArenaAllocator *)this_00,0x366bee);
  Profiler::Profiler(pPVar4,this->profilerArena);
  this->profiler = pPVar4;
  if (recycler != (Recycler *)0x0) {
    pAVar5 = Memory::Recycler::AddBackgroundProfilerArena(recycler);
    this->backgroundRecyclerProfilerArena = pAVar5;
    pPVar4 = (Profiler *)new<Memory::ArenaAllocator>(0x18d0,this->profilerArena,0x366bee);
    Profiler::Profiler(pPVar4,this->backgroundRecyclerProfilerArena);
    this->backgroundRecyclerProfiler = pPVar4;
    (**((pPVar4->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
        super_ArenaData.pageAllocator)->_vptr_PageAllocatorBase)();
    Profiler::Begin(this->backgroundRecyclerProfiler,AllPhase);
    (*((this->backgroundRecyclerProfiler->alloc->
       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).super_ArenaData.
      pageAllocator)->_vptr_PageAllocatorBase[1])();
  }
  Profiler::Begin(this->profiler,AllPhase);
  this->recycler = recycler;
  return;
}

Assistant:

void
    ScriptContextProfiler::Initialize(PageAllocator * pageAllocator, Recycler * recycler)
    {
        Assert(!IsInitialized());
        profilerArena = HeapNew(ArenaAllocator, _u("Profiler"), pageAllocator, Js::Throw::OutOfMemory);
        profiler = Anew(profilerArena, Profiler, profilerArena);
        if (recycler)
        {
            backgroundRecyclerProfilerArena = recycler->AddBackgroundProfilerArena();
            backgroundRecyclerProfiler = Anew(profilerArena, Profiler, backgroundRecyclerProfilerArena);

#if DBG
            //backgroundRecyclerProfiler is allocated from background and its guaranteed to assert below if we don't disable thread access check.
            backgroundRecyclerProfiler->alloc->GetPageAllocator()->SetDisableThreadAccessCheck();
#endif

            backgroundRecyclerProfiler->Begin(Js::AllPhase);

#if DBG
            backgroundRecyclerProfiler->alloc->GetPageAllocator()->SetEnableThreadAccessCheck();
#endif
        }
        profiler->Begin(Js::AllPhase);

        this->recycler = recycler;
    }